

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O3

int s_sha512_compress(sha512_state *md,uchar *buf)

{
  ulong64 *puVar1;
  ulong64 uVar2;
  ulong64 uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong auStack_330 [7];
  ulong64 local_2f8 [4];
  ulong local_2d8;
  ulong uStack_2d0;
  ulong local_2c8;
  ulong64 uStack_2c0;
  ulong local_2b8 [9];
  ulong64 local_270 [5];
  ulong auStack_248 [67];
  
  puVar1 = md->state;
  local_2f8[0] = md->state[0];
  local_2f8[1] = md->state[1];
  local_2f8[2] = md->state[2];
  local_2f8[3] = md->state[3];
  local_2d8 = md->state[4];
  uStack_2d0 = md->state[5];
  local_2c8 = md->state[6];
  uStack_2c0 = md->state[7];
  lVar4 = 0;
  do {
    uVar5 = *(ulong *)(buf + lVar4 * 8);
    local_2b8[lVar4] =
         uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
         (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
         (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10);
  lVar4 = 0x10;
  do {
    uVar5 = auStack_330[lVar4];
    uVar6 = (&local_2c8)[lVar4];
    local_2b8[lVar4] =
         (uVar5 >> 7 ^
         (uVar5 << 0x38 | uVar5 >> 8) ^ (uVar5 >> 1 | (ulong)((uVar5 & 1) != 0) << 0x3f)) +
         local_2b8[0] +
         (uVar6 >> 6 ^ (uVar6 << 3 | uVar6 >> 0x3d) ^ (uVar6 << 0x2d | uVar6 >> 0x13)) +
         local_2f8[lVar4 + 1];
    lVar4 = lVar4 + 1;
    local_2b8[0] = uVar5;
  } while (lVar4 != 0x50);
  uVar5 = 0xfffffffffffffff8;
  do {
    lVar4 = ((local_2d8 << 0x17 | local_2d8 >> 0x29) ^
            (local_2d8 << 0x2e | local_2d8 >> 0x12) ^ (local_2d8 << 0x32 | local_2d8 >> 0xe)) +
            uStack_2c0 + K[uVar5 + 8] + local_2b8[uVar5 + 8] +
            ((uStack_2d0 ^ local_2c8) & local_2d8 ^ local_2c8);
    uVar6 = local_2f8[3] + lVar4;
    uVar7 = (local_2f8[1] & local_2f8[0] | (local_2f8[1] | local_2f8[0]) & local_2f8[2]) +
            ((local_2f8[0] << 0x19 | local_2f8[0] >> 0x27) ^
            (local_2f8[0] << 0x1e | local_2f8[0] >> 0x22) ^
            (local_2f8[0] << 0x24 | local_2f8[0] >> 0x1c)) + lVar4;
    lVar4 = ((uStack_2d0 ^ local_2d8) & uVar6 ^ uStack_2d0) + local_2c8 + K[uVar5 + 9] +
            ((uVar6 * 0x800000 | uVar6 >> 0x29) ^
            (uVar6 << 0x2e | uVar6 >> 0x12) ^ (uVar6 << 0x32 | uVar6 >> 0xe)) + local_2b8[uVar5 + 9]
    ;
    local_2f8[2] = local_2f8[2] + lVar4;
    local_2c8 = (uVar7 & local_2f8[0] | (uVar7 | local_2f8[0]) & local_2f8[1]) +
                ((uVar7 * 0x2000000 | uVar7 >> 0x27) ^
                (uVar7 * 0x40000000 | uVar7 >> 0x22) ^ (uVar7 << 0x24 | uVar7 >> 0x1c)) + lVar4;
    lVar4 = uStack_2d0 + K[uVar5 + 10] + local_2b8[uVar5 + 10] +
            ((uVar6 ^ local_2d8) & local_2f8[2] ^ local_2d8) +
            ((local_2f8[2] * 0x800000 | local_2f8[2] >> 0x29) ^
            (local_2f8[2] << 0x2e | local_2f8[2] >> 0x12) ^
            (local_2f8[2] << 0x32 | local_2f8[2] >> 0xe));
    local_2f8[1] = local_2f8[1] + lVar4;
    uStack_2d0 = lVar4 + (local_2c8 & uVar7 | (local_2c8 | uVar7) & local_2f8[0]) +
                         ((local_2c8 * 0x2000000 | local_2c8 >> 0x27) ^
                         (local_2c8 * 0x40000000 | local_2c8 >> 0x22) ^
                         (local_2c8 << 0x24 | local_2c8 >> 0x1c));
    lVar4 = local_2d8 + K[uVar5 + 0xb] + local_2b8[uVar5 + 0xb] +
            ((local_2f8[2] ^ uVar6) & local_2f8[1] ^ uVar6) +
            ((local_2f8[1] * 0x800000 | local_2f8[1] >> 0x29) ^
            (local_2f8[1] << 0x2e | local_2f8[1] >> 0x12) ^
            (local_2f8[1] << 0x32 | local_2f8[1] >> 0xe));
    local_2f8[0] = local_2f8[0] + lVar4;
    local_2d8 = lVar4 + (uStack_2d0 & local_2c8 | (uStack_2d0 | local_2c8) & uVar7) +
                        ((uStack_2d0 * 0x2000000 | uStack_2d0 >> 0x27) ^
                        (uStack_2d0 * 0x40000000 | uStack_2d0 >> 0x22) ^
                        (uStack_2d0 << 0x24 | uStack_2d0 >> 0x1c));
    lVar4 = uVar6 + K[uVar5 + 0xc] + local_2b8[uVar5 + 0xc] +
            ((local_2f8[1] ^ local_2f8[2]) & local_2f8[0] ^ local_2f8[2]) +
            ((local_2f8[0] * 0x800000 | local_2f8[0] >> 0x29) ^
            (local_2f8[0] << 0x2e | local_2f8[0] >> 0x12) ^
            (local_2f8[0] << 0x32 | local_2f8[0] >> 0xe));
    uStack_2c0 = uVar7 + lVar4;
    local_2f8[3] = (local_2d8 & uStack_2d0 | (local_2d8 | uStack_2d0) & local_2c8) +
                   ((local_2d8 * 0x2000000 | local_2d8 >> 0x27) ^
                   (local_2d8 * 0x40000000 | local_2d8 >> 0x22) ^
                   (local_2d8 << 0x24 | local_2d8 >> 0x1c)) + lVar4;
    lVar4 = local_2f8[2] + K[uVar5 + 0xd] + local_2b8[uVar5 + 0xd] +
            ((local_2f8[0] ^ local_2f8[1]) & uStack_2c0 ^ local_2f8[1]) +
            ((uStack_2c0 * 0x800000 | uStack_2c0 >> 0x29) ^
            (uStack_2c0 << 0x2e | uStack_2c0 >> 0x12) ^ (uStack_2c0 << 0x32 | uStack_2c0 >> 0xe));
    local_2c8 = local_2c8 + lVar4;
    local_2f8[2] = (local_2f8[3] & local_2d8 | (local_2f8[3] | local_2d8) & uStack_2d0) +
                   ((local_2f8[3] * 0x2000000 | local_2f8[3] >> 0x27) ^
                   (local_2f8[3] * 0x40000000 | local_2f8[3] >> 0x22) ^
                   (local_2f8[3] << 0x24 | local_2f8[3] >> 0x1c)) + lVar4;
    lVar4 = local_2f8[1] + K[uVar5 + 0xe] + local_2b8[uVar5 + 0xe] +
            ((uStack_2c0 ^ local_2f8[0]) & local_2c8 ^ local_2f8[0]) +
            ((local_2c8 * 0x800000 | local_2c8 >> 0x29) ^
            (local_2c8 << 0x2e | local_2c8 >> 0x12) ^ (local_2c8 << 0x32 | local_2c8 >> 0xe));
    uStack_2d0 = uStack_2d0 + lVar4;
    local_2f8[1] = (local_2f8[2] & local_2f8[3] | (local_2f8[2] | local_2f8[3]) & local_2d8) +
                   ((local_2f8[2] * 0x2000000 | local_2f8[2] >> 0x27) ^
                   (local_2f8[2] * 0x40000000 | local_2f8[2] >> 0x22) ^
                   (local_2f8[2] << 0x24 | local_2f8[2] >> 0x1c)) + lVar4;
    lVar4 = local_2f8[0] + K[uVar5 + 0xf] + local_2b8[uVar5 + 0xf] +
            ((local_2c8 ^ uStack_2c0) & uStack_2d0 ^ uStack_2c0) +
            ((uStack_2d0 * 0x800000 | uStack_2d0 >> 0x29) ^
            (uStack_2d0 << 0x2e | uStack_2d0 >> 0x12) ^ (uStack_2d0 << 0x32 | uStack_2d0 >> 0xe));
    local_2d8 = local_2d8 + lVar4;
    local_2f8[0] = (local_2f8[1] & local_2f8[2] | (local_2f8[1] | local_2f8[2]) & local_2f8[3]) +
                   ((local_2f8[1] * 0x2000000 | local_2f8[1] >> 0x27) ^
                   (local_2f8[1] * 0x40000000 | local_2f8[1] >> 0x22) ^
                   (local_2f8[1] << 0x24 | local_2f8[1] >> 0x1c)) + lVar4;
    uVar5 = uVar5 + 8;
  } while (uVar5 < 0x48);
  lVar4 = 0;
  do {
    uVar2 = (puVar1 + lVar4)[1];
    uVar3 = local_2f8[lVar4 + 1];
    puVar1[lVar4] = puVar1[lVar4] + local_2f8[lVar4];
    (puVar1 + lVar4)[1] = uVar2 + uVar3;
    lVar4 = lVar4 + 2;
  } while (lVar4 != 8);
  return (int)puVar1;
}

Assistant:

static int s_sha512_compress(struct sha512_state * md, const unsigned char *buf)
{
    ulong64 S[8], W[80], t0, t1;
    int i;

    /* copy state into S */
    for (i = 0; i < 8; i++) {
        S[i] = md->state[i];
    }

    /* copy the state into 1024-bits into W[0..15] */
    for (i = 0; i < 16; i++) {
        LOAD64H(W[i], buf + (8*i));
    }

    /* fill W[16..79] */
    for (i = 16; i < 80; i++) {
        W[i] = Gamma1(W[i - 2]) + W[i - 7] + Gamma0(W[i - 15]) + W[i - 16];
    }

    /* Compress */
#define RND(a,b,c,d,e,f,g,h,i)                         \
     t0 = h + Sigma1(e) + Ch(e, f, g) + K[i] + W[i];   \
     t1 = Sigma0(a) + Maj(a, b, c);                    \
     d += t0;                                          \
     h  = t0 + t1;

    for (i = 0; i < 80; i += 8) {
        RND(S[0],S[1],S[2],S[3],S[4],S[5],S[6],S[7],i+0);
        RND(S[7],S[0],S[1],S[2],S[3],S[4],S[5],S[6],i+1);
        RND(S[6],S[7],S[0],S[1],S[2],S[3],S[4],S[5],i+2);
        RND(S[5],S[6],S[7],S[0],S[1],S[2],S[3],S[4],i+3);
        RND(S[4],S[5],S[6],S[7],S[0],S[1],S[2],S[3],i+4);
        RND(S[3],S[4],S[5],S[6],S[7],S[0],S[1],S[2],i+5);
        RND(S[2],S[3],S[4],S[5],S[6],S[7],S[0],S[1],i+6);
        RND(S[1],S[2],S[3],S[4],S[5],S[6],S[7],S[0],i+7);
    }

    /* feedback */
    for (i = 0; i < 8; i++) {
        md->state[i] = md->state[i] + S[i];
    }

    return 0;
}